

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall QStyleSheetStyle::unsetPalette(QStyleSheetStyle *this,QWidget *w)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *this_00;
  Entry *pEVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  char cVar7;
  bool bVar8;
  QPalette *pQVar9;
  QWidget *pQVar10;
  QWidget *w_00;
  QMetaType QVar11;
  Node<const_QWidget_*,_QHashDummyValue> *pNVar12;
  ulong uVar13;
  anon_union_24_3_e3d07ef4_for_data *paVar14;
  long in_FS_OFFSET;
  iterator it;
  QPalette current;
  QFont t;
  QWidget *local_80;
  QPalette local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = w;
  cVar7 = QCoreApplication::testAttribute(AA_UseStyleSheetPropagationInWidgetStyles);
  paVar14 = (anon_union_24_3_e3d07ef4_for_data *)&styleSheetCaches->customPaletteWidgets;
  it = QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>::findImpl<QWidget_const*>
                 ((QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>> *)paVar14->data,
                  &local_80);
  if (it.i.d != (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>
                 *)0x0 || it.i.bucket != 0) {
    pSVar2 = (it.i.d)->spans;
    uVar13 = it.i.bucket >> 7;
    pEVar3 = pSVar2[uVar13].entries;
    bVar1 = pSVar2[uVar13].offsets[(uint)it.i.bucket & 0x7f];
    local_48.shared = (PrivateShared *)*(undefined8 *)(pEVar3[bVar1].storage.data + 8);
    pEVar4 = pEVar3 + bVar1;
    (pEVar4->storage).data[8] = '\0';
    (pEVar4->storage).data[9] = '\0';
    (pEVar4->storage).data[10] = '\0';
    (pEVar4->storage).data[0xb] = '\0';
    (pEVar4->storage).data[0xc] = '\0';
    (pEVar4->storage).data[0xd] = '\0';
    (pEVar4->storage).data[0xe] = '\0';
    (pEVar4->storage).data[0xf] = '\0';
    local_48._12_4_ = 0xaaaaaaaa;
    local_48._8_4_ = *(undefined4 *)(pEVar3[bVar1].storage.data + 0x10);
    local_48._16_8_ = *(undefined8 *)(pEVar3[bVar1].storage.data + 0x18);
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>::erase
              (&styleSheetCaches->customPaletteWidgets,(const_iterator)it.i);
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPalette::QPalette((QPalette *)local_58);
    if (cVar7 == '\0') {
      QPalette::operator=((QPalette *)local_58,(QPalette *)&local_48);
    }
    else {
      pQVar9 = QWidget::palette(local_80);
      QPalette::QPalette(&local_78,pQVar9);
      current._8_8_ = &local_78;
      current.d = (QPalettePrivate *)&local_48;
      QStyleSheetStyleCaches::Tampered<QPalette>::reverted((Tampered<QPalette> *)local_68,current);
      uVar5 = local_58._0_8_;
      uVar6 = local_58._8_4_;
      local_58._8_4_ = local_68._8_4_;
      local_68._8_4_ = uVar6;
      local_58._0_8_ = local_68._0_8_;
      local_68._0_8_ = uVar5;
      QPalette::~QPalette((QPalette *)local_68);
      QPalette::~QPalette(&local_78);
    }
    QWidget::setPalette(local_80,(QPalette *)local_58);
    pQVar10 = embeddedWidget(local_80);
    if (pQVar10 != local_80) {
      QWidget::setPalette(pQVar10,(QPalette *)local_58);
    }
    QPalette::~QPalette((QPalette *)local_58);
    paVar14 = &local_48;
    QPalette::~QPalette((QPalette *)paVar14);
  }
  if (cVar7 == '\0') {
    paVar14 = &local_48;
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QObject::property((char *)paVar14->data);
    pQVar10 = local_80;
    if ((undefined1 *)0x3 < puStack_30) {
      local_68._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QFont>::metaType;
      local_58._0_8_ = (ulong)puStack_30 & 0xfffffffffffffffc;
      bVar8 = comparesEqual((QMetaType *)local_58,(QMetaType *)local_68);
      if (bVar8) {
        if (((ulong)puStack_30 & 1) == 0) {
          paVar14 = &local_48;
        }
        else {
          paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                    (local_48.shared + *(int *)(local_48.shared + 4));
        }
        QFont::QFont((QFont *)local_58,(QFont *)paVar14->data);
      }
      else {
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QFont::QFont((QFont *)local_58);
        QVar11.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if (((ulong)puStack_30 & 1) != 0) {
          paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                    (local_48.shared + *(int *)(local_48.shared + 4));
        }
        QMetaType::convert(QVar11,paVar14,(QMetaType)local_68._0_8_,local_58);
      }
      QWidget::setFont(pQVar10,(QFont *)local_58);
      QFont::~QFont((QFont *)local_58);
    }
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  else {
    unsetStyleSheetFont((QStyleSheetStyle *)paVar14->data,local_80);
    pQVar10 = local_80;
    w_00 = embeddedWidget(local_80);
    if (w_00 != local_80) {
      unsetStyleSheetFont((QStyleSheetStyle *)pQVar10,w_00);
    }
  }
  this_00 = (styleSheetCaches->autoFillDisabledWidgets).q_hash.d;
  if (this_00 != (Data *)0x0) {
    pNVar12 = QHashPrivate::Data<QHashPrivate::Node<QWidget_const*,QHashDummyValue>>::
              findNode<QWidget_const*>
                        ((Data<QHashPrivate::Node<QWidget_const*,QHashDummyValue>> *)this_00,
                         &local_80);
    if (pNVar12 != (Node<const_QWidget_*,_QHashDummyValue> *)0x0) {
      pQVar10 = embeddedWidget(local_80);
      QWidget::setAutoFillBackground(pQVar10,true);
      QHash<QWidget_const*,QHashDummyValue>::removeImpl<QWidget_const*>
                ((QHash<QWidget_const*,QHashDummyValue> *)&styleSheetCaches->autoFillDisabledWidgets
                 ,&local_80);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::unsetPalette(QWidget *w)
{
    const bool useStyleSheetPropagationInWidgetStyles =
        QCoreApplication::testAttribute(Qt::AA_UseStyleSheetPropagationInWidgetStyles);

    const auto it = styleSheetCaches->customPaletteWidgets.find(w);
    if (it != styleSheetCaches->customPaletteWidgets.end()) {
        auto customizedPalette = std::move(*it);
        styleSheetCaches->customPaletteWidgets.erase(it);

        QPalette original;
        if (useStyleSheetPropagationInWidgetStyles)
            original = std::move(customizedPalette).reverted(w->palette());
        else
            original = customizedPalette.oldWidgetValue;

        w->setPalette(original);
        QWidget *ew = embeddedWidget(w);
        if (ew != w)
            ew->setPalette(original);
    }

    if (useStyleSheetPropagationInWidgetStyles) {
        unsetStyleSheetFont(w);
        QWidget *ew = embeddedWidget(w);
        if (ew != w)
            unsetStyleSheetFont(ew);
    } else {
        QVariant oldFont = w->property("_q_styleSheetWidgetFont");
        if (oldFont.isValid()) {
            w->setFont(qvariant_cast<QFont>(oldFont));
        }
    }

    if (styleSheetCaches->autoFillDisabledWidgets.contains(w)) {
        embeddedWidget(w)->setAutoFillBackground(true);
        styleSheetCaches->autoFillDisabledWidgets.remove(w);
    }
}